

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

bool NumberTemp::IsTempUse(Instr *instr,Sym *sym,BackwardPass *backwardPass)

{
  bool bVar1;
  Opnd *this;
  IndirOpnd *this_00;
  RegOpnd *this_01;
  byte local_2d;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2c;
  OpCode local_2a;
  BackwardPass *pBStack_28;
  OpCode opcode;
  BackwardPass *backwardPass_local;
  Sym *sym_local;
  Instr *instr_local;
  
  local_2a = instr->m_opcode;
  pBStack_28 = backwardPass;
  backwardPass_local = (BackwardPass *)sym;
  sym_local = (Sym *)instr;
  bVar1 = OpCodeAttr::NonTempNumberSources(local_2a);
  if ((bVar1) ||
     ((bVar1 = OpCodeAttr::TempNumberTransfer(local_2a), bVar1 &&
      ((*(ushort *)((long)&sym_local[2]._vptr_Sym + 6) >> 1 & 1) == 0)))) {
    local_2d = 1;
    if (local_2a == StElemI_A) {
      this = IR::Instr::GetDst((Instr *)sym_local);
      this_00 = IR::Opnd::AsIndirOpnd(this);
      this_01 = IR::IndirOpnd::GetBaseOpnd(this_00);
      local_2c.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&this_01->super_Opnd);
      bVar1 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_2c.field_0);
      local_2d = bVar1 ^ 0xff;
    }
    if ((local_2d & 1) != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool
NumberTemp::IsTempUse(IR::Instr * instr, Sym * sym, BackwardPass * backwardPass)
{
    Js::OpCode opcode = instr->m_opcode;
    if (OpCodeAttr::NonTempNumberSources(opcode)
        || (OpCodeAttr::TempNumberTransfer(opcode) && !instr->dstIsTempNumber))
    {
        // For TypedArray stores, we don't store the Var object, so MarkTemp is valid
        if (opcode != Js::OpCode::StElemI_A
            || !instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyOptimizedTypedArray())
        {
            // Mark the symbol as non-tempable if the instruction doesn't allow temp sources,
            // or it is transferred to a non-temp dst
            return false;
        }
    }
    return true;
}